

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

Attribute * Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>_>::makeNewAttribute(void)

{
  TypedAttribute<Imath_3_2::Matrix44<double>_> *this;
  
  this = (TypedAttribute<Imath_3_2::Matrix44<double>_> *)operator_new(0x88);
  (this->_value).x[3][1] = 0.0;
  (this->_value).x[3][2] = 0.0;
  (this->_value).x[2][3] = 0.0;
  (this->_value).x[3][0] = 0.0;
  (this->_value).x[2][1] = 0.0;
  (this->_value).x[2][2] = 0.0;
  (this->_value).x[1][3] = 0.0;
  (this->_value).x[2][0] = 0.0;
  (this->_value).x[1][1] = 0.0;
  (this->_value).x[1][2] = 0.0;
  (this->_value).x[0][3] = 0.0;
  (this->_value).x[1][0] = 0.0;
  (this->_value).x[0][1] = 0.0;
  (this->_value).x[0][2] = 0.0;
  (this->super_Attribute)._vptr_Attribute = (_func_int **)0x0;
  (this->_value).x[0][0] = 0.0;
  (this->_value).x[3][3] = 0.0;
  TypedAttribute(this);
  return &this->super_Attribute;
}

Assistant:

Attribute*
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T> ();
}